

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::begin_member_or_element
          (basic_json_parser<char,_std::allocator<char>_> *this,error_code *ec)

{
  parse_state pVar1;
  bool bVar2;
  
  pVar1 = parent(this);
  if (pVar1 != root) {
    if (pVar1 == array) {
      this->state_ = expect_value;
    }
    else if (pVar1 == object) {
      this->state_ = expect_member_name;
    }
    else {
      bVar2 = std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
                        (&this->err_handler_,syntax_error,&this->super_ser_context);
      this->more_ = bVar2;
      if (!bVar2) {
        std::error_code::operator=(ec,syntax_error);
        return;
      }
    }
  }
  return;
}

Assistant:

void begin_member_or_element(std::error_code& ec) 
    {
        switch (parent())
        {
            case parse_state::object:
                state_ = parse_state::expect_member_name;
                break;
            case parse_state::array:
                state_ = parse_state::expect_value;
                break;
            case parse_state::root:
                break;
            default:
                more_ = err_handler_(json_errc::syntax_error, *this);
                if (!more_)
                {
                    ec = json_errc::syntax_error;
                    return;
                }
                break;
        }
    }